

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees_emit.h
# Opt level: O0

void zng_tr_emit_tree(deflate_state *s,int type,int last)

{
  int iVar1;
  ulong lld;
  uint uVar2;
  byte bVar3;
  uint32_t total_bits;
  uint32_t len;
  uint64_t val;
  ulong uStack_28;
  uint32_t header_bits;
  uint64_t bi_buf;
  uint32_t bi_valid;
  int last_local;
  int type_local;
  deflate_state *s_local;
  
  iVar1 = s->bi_valid;
  lld = s->bi_buf;
  uVar2 = type * 2 + last;
  uStack_28 = (ulong)uVar2;
  bi_buf._4_4_ = iVar1 + 3;
  bVar3 = (byte)iVar1;
  if (bi_buf._4_4_ < 0x40) {
    uStack_28 = uStack_28 << (bVar3 & 0x3f) | lld;
  }
  else if (iVar1 == 0x40) {
    put_uint64(s,lld);
    bi_buf._4_4_ = 3;
  }
  else {
    put_uint64(s,uStack_28 << (bVar3 & 0x3f) | lld);
    uStack_28 = (ulong)(uVar2 >> (0x40 - bVar3 & 0x3f));
    bi_buf._4_4_ = iVar1 - 0x3d;
  }
  s->bi_valid = bi_buf._4_4_;
  s->bi_buf = uStack_28;
  return;
}

Assistant:

static inline void zng_tr_emit_tree(deflate_state *s, int type, const int last) {
    uint32_t bi_valid = s->bi_valid;
    uint64_t bi_buf = s->bi_buf;
    uint32_t header_bits = (type << 1) + last;
    send_bits(s, header_bits, 3, bi_buf, bi_valid);
    cmpr_bits_add(s, 3);
    s->bi_valid = bi_valid;
    s->bi_buf = bi_buf;
    Tracev((stderr, "\n--- Emit Tree: Last: %u\n", last));
}